

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

void activate_randart_file(void)

{
  char *base;
  char *pcVar1;
  char old [1024];
  char new [1024];
  char acStack_818 [1024];
  char local_418 [1032];
  
  base = ANGBAND_DIR_ARCHIVE;
  pcVar1 = "";
  if (archive_user_pfx != (char *)0x0) {
    pcVar1 = archive_user_pfx;
  }
  pcVar1 = format("%srandart_%08lx.txt",pcVar1,(ulong)seed_randart);
  path_build(acStack_818,0x400,base,pcVar1);
  path_build(local_418,0x400,ANGBAND_DIR_USER,"randart.txt");
  safe_setuid_grab();
  file_move(acStack_818,local_418);
  safe_setuid_drop();
  return;
}

Assistant:

void activate_randart_file(void)
{
	char new[1024];
	char old[1024];

	/* Get the randart filename and path */
	path_build(old, sizeof(old), ANGBAND_DIR_ARCHIVE,
		format("%srandart_%08lx.txt",
		(archive_user_pfx) ? archive_user_pfx : "",
		(unsigned long)seed_randart));

	/* Move it into place */
	path_build(new, sizeof(new), ANGBAND_DIR_USER, "randart.txt");
	safe_setuid_grab();
	file_move(old, new);
	safe_setuid_drop();
}